

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O0

CURLcode Curl_hmacit(HMAC_params *hashparams,uchar *key,size_t keylen,uchar *data,size_t datalen,
                    uchar *output)

{
  uint uVar1;
  HMAC_context *ctxt_00;
  HMAC_context *ctxt;
  uchar *output_local;
  size_t datalen_local;
  uchar *data_local;
  size_t keylen_local;
  uchar *key_local;
  HMAC_params *hashparams_local;
  
  uVar1 = curlx_uztoui(keylen);
  ctxt_00 = Curl_HMAC_init(hashparams,key,uVar1);
  if (ctxt_00 == (HMAC_context *)0x0) {
    hashparams_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    uVar1 = curlx_uztoui(datalen);
    Curl_HMAC_update(ctxt_00,data,uVar1);
    Curl_HMAC_final(ctxt_00,output);
    hashparams_local._4_4_ = CURLE_OK;
  }
  return hashparams_local._4_4_;
}

Assistant:

CURLcode Curl_hmacit(const struct HMAC_params *hashparams,
                     const unsigned char *key, const size_t keylen,
                     const unsigned char *data, const size_t datalen,
                     unsigned char *output)
{
  struct HMAC_context *ctxt =
    Curl_HMAC_init(hashparams, key, curlx_uztoui(keylen));

  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  /* Update the digest with the given challenge */
  Curl_HMAC_update(ctxt, data, curlx_uztoui(datalen));

  /* Finalise the digest */
  Curl_HMAC_final(ctxt, output);

  return CURLE_OK;
}